

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int add_double_attr(attr_list list,atom_t attr_id,double dvalue)

{
  attr_union value;
  int iVar1;
  undefined4 in_ESI;
  undefined8 in_XMM0_Qa;
  attr_union tmp;
  attr_value_type t;
  attr_value_type in_stack_ffffffffffffffd8;
  atom_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  value.u._8_4_ = in_stack_fffffffffffffff0;
  value.u.d = (double)in_XMM0_Qa;
  value.u._12_4_ = in_ESI;
  iVar1 = add_pattr((attr_list)CONCAT44(8,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                    in_stack_ffffffffffffffd8,value);
  return iVar1;
}

Assistant:

extern int
add_double_attr(attr_list list, atom_t attr_id, double dvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.d = dvalue;
    if (sizeof(double) == 8) t = Attr_Float8;
    if (sizeof(double) == 16) t = Attr_Float16;
    return add_pattr(list, attr_id, t, tmp);
}